

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void __thiscall
embree::sse42::
BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::QuadMiIntersectorKMoeller<4,_4,_true>_>,_true>
::occluded(BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::QuadMiIntersectorKMoeller<4,_4,_true>_>,_true>
           *this,vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  char **ppcVar1;
  BVH *bvh;
  NodeRef root;
  long lVar2;
  long lVar3;
  code *pcVar4;
  size_t k;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  uint uVar18;
  uint uVar19;
  undefined4 uVar20;
  int iVar21;
  ulong uVar22;
  RTCRayN *pRVar23;
  ulong uVar24;
  int iVar25;
  Intersectors *pIVar26;
  long lVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  uint uVar31;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar32;
  NodeRef *pNVar33;
  bool bVar34;
  float fVar44;
  vint4 bi_1;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  uint uVar45;
  uint uVar59;
  undefined1 auVar47 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar58;
  float fVar60;
  float fVar72;
  float fVar73;
  vint4 bi;
  float fVar74;
  undefined1 auVar61 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar62;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  float fVar75;
  float fVar76;
  float fVar79;
  float fVar80;
  vint4 ai;
  undefined1 auVar77 [16];
  float fVar81;
  undefined1 auVar78 [16];
  float fVar82;
  float fVar83;
  float fVar85;
  float fVar86;
  vint4 ai_1;
  float fVar87;
  undefined1 auVar84 [16];
  float fVar88;
  float fVar93;
  float fVar94;
  vint4 ai_3;
  undefined1 auVar89 [16];
  float fVar95;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  float fVar96;
  float fVar97;
  float fVar100;
  float fVar102;
  vint4 bi_2;
  uint uVar103;
  float fVar105;
  uint uVar106;
  undefined1 auVar98 [16];
  float fVar101;
  float fVar104;
  undefined1 auVar99 [16];
  float fVar107;
  float fVar108;
  float fVar114;
  float fVar115;
  vint4 bi_3;
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  uint uVar116;
  float fVar117;
  uint uVar118;
  float fVar119;
  uint uVar120;
  float fVar121;
  vint4 ai_2;
  uint uVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  uint uVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  int iVar144;
  int iVar145;
  int iVar146;
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar150;
  float fVar151;
  float fVar152;
  float fVar154;
  float fVar155;
  float fVar156;
  float fVar157;
  float fVar158;
  undefined1 auVar153 [16];
  TravRayK<4,_false> *tray_00;
  Precalculations pre;
  undefined1 local_1968 [16];
  vbool<4> terminated;
  RTCFilterFunctionNArguments args;
  undefined1 local_18d8 [8];
  float fStack_18d0;
  float fStack_18cc;
  undefined8 local_18c8;
  undefined8 uStack_18c0;
  undefined8 local_1878;
  undefined8 uStack_1870;
  undefined1 local_1868 [16];
  undefined1 local_1858 [16];
  undefined1 local_1848 [16];
  undefined1 local_1838 [16];
  undefined1 local_1828 [16];
  uint local_1818;
  uint uStack_1814;
  uint uStack_1810;
  uint uStack_180c;
  undefined4 local_1808;
  undefined4 uStack_1804;
  undefined4 uStack_1800;
  undefined4 uStack_17fc;
  undefined4 local_17f8;
  undefined4 uStack_17f4;
  undefined4 uStack_17f0;
  undefined4 uStack_17ec;
  TravRayK<4,_false> tray;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  undefined1 auVar46 [16];
  
  uVar17 = mm_lookupmask_ps._248_8_;
  uVar16 = mm_lookupmask_ps._240_8_;
  uVar15 = mm_lookupmask_ps._8_8_;
  uVar14 = mm_lookupmask_ps._0_8_;
  bvh = (BVH *)(valid_i->field_0).v[0];
  stack_node[1].ptr = (bvh->root).ptr;
  if (stack_node[1].ptr != 8) {
    pIVar26 = This;
    if ((*(long *)(ray + 8) != 0) &&
       (pIVar26 = *(Intersectors **)(ray + 0x10), ((ulong)pIVar26->ptr & 0x10000) != 0)) {
      occludedCoherent(this,valid_i,This,ray,context);
      return;
    }
    auVar77 = *(undefined1 (*) [16])&(This->intersector4_nofilter).name;
    auVar71._0_12_ = ZEXT812(0);
    auVar71._12_4_ = 0;
    uVar45 = -(uint)(*(int *)this == -1 && 0.0 <= auVar77._0_4_);
    uVar59 = -(uint)(*(int *)(this + 4) == -1 && 0.0 <= auVar77._4_4_);
    auVar46._0_8_ = CONCAT44(uVar59,uVar45);
    auVar46._8_4_ = -(uint)(*(int *)(this + 8) == -1 && 0.0 <= auVar77._8_4_);
    auVar46._12_4_ = -(uint)(*(int *)(this + 0xc) == -1 && 0.0 <= auVar77._12_4_);
    iVar25 = movmskps((int)pIVar26,auVar46);
    if (iVar25 != 0) {
      tray.org.field_0._0_8_ = This->ptr;
      tray.org.field_0._8_8_ = This->leafIntersector;
      tray.org.field_0._16_8_ = (This->collider).collide;
      tray.org.field_0._24_8_ = (This->collider).name;
      tray.org.field_0._32_8_ = (This->intersector1).intersect;
      tray.org.field_0._40_8_ = (This->intersector1).occluded;
      tray.dir.field_0._0_8_ = (This->intersector4).intersect;
      tray.dir.field_0._8_8_ = (This->intersector4).occluded;
      tray.dir.field_0.field_0.y.field_0 =
           (vfloat_impl<4>)*(undefined1 (*) [16])&(This->intersector4).name;
      tray.dir.field_0._32_8_ = (This->intersector4_filter).occluded;
      tray.dir.field_0._40_8_ = (This->intersector4_filter).name;
      fVar96 = (float)DAT_01f80d30;
      fVar100 = DAT_01f80d30._4_4_;
      fVar102 = DAT_01f80d30._8_4_;
      fVar105 = DAT_01f80d30._12_4_;
      auVar47._4_4_ = -(uint)(ABS((float)((ulong)tray.dir.field_0._0_8_ >> 0x20)) < fVar100);
      auVar47._0_4_ = -(uint)(ABS((float)tray.dir.field_0._0_8_) < fVar96);
      auVar47._8_4_ = -(uint)(ABS((float)tray.dir.field_0._8_8_) < fVar102);
      auVar47._12_4_ = -(uint)(ABS((float)((ulong)tray.dir.field_0._8_8_ >> 0x20)) < fVar105);
      auVar109 = blendvps((undefined1  [16])tray.dir.field_0.field_0.x.field_0,_DAT_01f80d30,auVar47
                         );
      auVar89._4_4_ = -(uint)(ABS(tray.dir.field_0._20_4_) < fVar100);
      auVar89._0_4_ = -(uint)(ABS(tray.dir.field_0._16_4_) < fVar96);
      auVar89._8_4_ = -(uint)(ABS(tray.dir.field_0._24_4_) < fVar102);
      auVar89._12_4_ = -(uint)(ABS(tray.dir.field_0._28_4_) < fVar105);
      auVar47 = blendvps((undefined1  [16])tray.dir.field_0.field_0.y.field_0,_DAT_01f80d30,auVar89)
      ;
      auVar35._4_4_ = -(uint)(ABS((float)((ulong)tray.dir.field_0._32_8_ >> 0x20)) < fVar100);
      auVar35._0_4_ = -(uint)(ABS((float)tray.dir.field_0._32_8_) < fVar96);
      auVar35._8_4_ = -(uint)(ABS((float)tray.dir.field_0._40_8_) < fVar102);
      auVar35._12_4_ = -(uint)(ABS((float)((ulong)tray.dir.field_0._40_8_ >> 0x20)) < fVar105);
      auVar89 = blendvps((undefined1  [16])tray.dir.field_0.field_0.z.field_0,_DAT_01f80d30,auVar35)
      ;
      auVar36 = rcpps(auVar35,auVar109);
      fVar96 = auVar36._0_4_;
      auVar110._0_4_ = auVar109._0_4_ * fVar96;
      fVar100 = auVar36._4_4_;
      auVar110._4_4_ = auVar109._4_4_ * fVar100;
      fVar102 = auVar36._8_4_;
      auVar110._8_4_ = auVar109._8_4_ * fVar102;
      fVar105 = auVar36._12_4_;
      auVar110._12_4_ = auVar109._12_4_ * fVar105;
      tray.rdir.field_0._0_4_ = (1.0 - auVar110._0_4_) * fVar96 + fVar96;
      tray.rdir.field_0._4_4_ = (1.0 - auVar110._4_4_) * fVar100 + fVar100;
      tray.rdir.field_0._8_4_ = (1.0 - auVar110._8_4_) * fVar102 + fVar102;
      tray.rdir.field_0._12_4_ = (1.0 - auVar110._12_4_) * fVar105 + fVar105;
      auVar36 = rcpps(auVar110,auVar47);
      fVar96 = auVar36._0_4_;
      fVar100 = auVar36._4_4_;
      fVar102 = auVar36._8_4_;
      fVar105 = auVar36._12_4_;
      tray.rdir.field_0._16_4_ = (1.0 - auVar47._0_4_ * fVar96) * fVar96 + fVar96;
      tray.rdir.field_0._20_4_ = (1.0 - auVar47._4_4_ * fVar100) * fVar100 + fVar100;
      tray.rdir.field_0._24_4_ = (1.0 - auVar47._8_4_ * fVar102) * fVar102 + fVar102;
      tray.rdir.field_0._28_4_ = (1.0 - auVar47._12_4_ * fVar105) * fVar105 + fVar105;
      auVar36 = rcpps(auVar36,auVar89);
      fVar96 = auVar36._0_4_;
      fVar100 = auVar36._4_4_;
      fVar102 = auVar36._8_4_;
      fVar105 = auVar36._12_4_;
      tray.rdir.field_0._32_4_ = (1.0 - auVar89._0_4_ * fVar96) * fVar96 + fVar96;
      tray.rdir.field_0._36_4_ = (1.0 - auVar89._4_4_ * fVar100) * fVar100 + fVar100;
      tray.rdir.field_0._40_4_ = (1.0 - auVar89._8_4_ * fVar102) * fVar102 + fVar102;
      tray.rdir.field_0._44_4_ = (1.0 - auVar89._12_4_ * fVar105) * fVar105 + fVar105;
      tray.nearXYZ.field_0._0_4_ = -(uint)((float)tray.rdir.field_0._0_4_ < 0.0) & 0x10;
      tray.nearXYZ.field_0._4_4_ = -(uint)((float)tray.rdir.field_0._4_4_ < 0.0) & 0x10;
      tray.nearXYZ.field_0._8_4_ = -(uint)((float)tray.rdir.field_0._8_4_ < 0.0) & 0x10;
      tray.nearXYZ.field_0._12_4_ = -(uint)((float)tray.rdir.field_0._12_4_ < 0.0) & 0x10;
      auVar109._4_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._20_4_);
      auVar109._0_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._16_4_);
      auVar109._8_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._24_4_);
      auVar109._12_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._28_4_);
      tray.nearXYZ.field_0.field_0.y.field_0 =
           (vint_impl<4>)blendvps(_DAT_01faeed0,_DAT_01f8c1f0,auVar109);
      auVar37._4_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._36_4_);
      auVar37._0_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._32_4_);
      auVar37._8_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._40_4_);
      auVar37._12_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._44_4_);
      tray.nearXYZ.field_0.field_0.z.field_0 =
           (vint_impl<4>)blendvps(_DAT_01faeef0,_DAT_01faeee0,auVar37);
      auVar36._0_8_ = (This->intersector1).pointQuery;
      auVar36._8_8_ = (This->intersector1).name;
      auVar36 = maxps(auVar36,auVar71);
      auVar77 = maxps(auVar77,auVar71);
      iVar25 = (int)DAT_01f7a9f0;
      iVar144 = DAT_01f7a9f0._4_4_;
      iVar145 = DAT_01f7a9f0._8_4_;
      iVar146 = DAT_01f7a9f0._12_4_;
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           blendvps((undefined1  [16])_DAT_01f7a9f0,auVar36,auVar46);
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)blendvps(_DAT_01f7aa00,auVar77,auVar46);
      terminated.field_0._0_8_ = auVar46._0_8_ ^ 0xffffffffffffffff;
      terminated.field_0.i[2] = auVar46._8_4_ ^ 0xffffffff;
      terminated.field_0.i[3] = auVar46._12_4_ ^ 0xffffffff;
      if (*(long *)(ray + 8) == 0) {
        uVar31 = 3;
      }
      else {
        uVar31 = ((*(byte *)(*(long *)(ray + 0x10) + 2) & 1) == 0) + 2;
      }
      pNVar33 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar32 = &stack_near[2].field_0;
      stack_near[0].field_0 = _DAT_01f7a9f0;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      uVar18 = 0x21d2f80;
LAB_00234d49:
      do {
        do {
          root.ptr = pNVar33[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_00235d3a;
          pNVar33 = pNVar33 + -1;
          paVar32 = paVar32 + -1;
          aVar48.v = *(__m128 *)paVar32->v;
          auVar77._4_4_ = -(uint)(aVar48._4_4_ < tray.tfar.field_0.v[1]);
          auVar77._0_4_ = -(uint)(aVar48._0_4_ < tray.tfar.field_0.v[0]);
          auVar77._8_4_ = -(uint)(aVar48._8_4_ < tray.tfar.field_0.v[2]);
          auVar77._12_4_ = -(uint)(aVar48._12_4_ < tray.tfar.field_0.v[3]);
          uVar18 = movmskps(uVar18,auVar77);
        } while (uVar18 == 0);
        uVar29 = (ulong)(byte)uVar18;
        uVar19 = POPCOUNT(uVar18 & 0xff);
        uVar18 = uVar19;
        if (uVar31 < uVar19) {
LAB_00234d87:
          do {
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_00235d3a;
              auVar40._4_4_ = -(uint)(aVar48.v[1] < tray.tfar.field_0.v[1]);
              auVar40._0_4_ = -(uint)(aVar48.v[0] < tray.tfar.field_0.v[0]);
              auVar40._8_4_ = -(uint)(aVar48.v[2] < tray.tfar.field_0.v[2]);
              auVar40._12_4_ = -(uint)(aVar48.v[3] < tray.tfar.field_0.v[3]);
              uVar18 = movmskps(uVar18,auVar40);
              if (uVar18 == 0) goto LAB_00234d49;
              uVar29 = (ulong)((uint)root.ptr & 0xf);
              if (uVar29 != 8) {
                lVar27 = (root.ptr & 0xfffffffffffffff0) + 0x50;
                uVar24 = 0;
                auVar49._8_4_ = terminated.field_0._8_4_ ^ 0xffffffff;
                auVar49._0_8_ = terminated.field_0._0_8_ ^ 0xffffffffffffffff;
                auVar49._12_4_ = terminated.field_0._12_4_ ^ 0xffffffff;
                goto LAB_00234f7a;
              }
              uVar20 = 0;
              aVar58 = terminated.field_0;
              goto LAB_00235c3b;
            }
            lVar27 = 0;
            aVar48.i[1] = iVar144;
            aVar48.i[0] = iVar25;
            aVar48.i[2] = iVar145;
            aVar48.i[3] = iVar146;
            uVar29 = 8;
            do {
              uVar24 = *(ulong *)((root.ptr & 0xfffffffffffffff0) + lVar27 * 8);
              if (uVar24 == 8) break;
              fVar96 = *(float *)(root.ptr + 0x20 + lVar27 * 4);
              fVar100 = *(float *)(root.ptr + 0x30 + lVar27 * 4);
              fVar102 = *(float *)(root.ptr + 0x40 + lVar27 * 4);
              fVar105 = *(float *)(root.ptr + 0x50 + lVar27 * 4);
              fVar75 = (fVar96 - (float)tray.org.field_0._0_4_) * (float)tray.rdir.field_0._0_4_;
              fVar79 = (fVar96 - (float)tray.org.field_0._4_4_) * (float)tray.rdir.field_0._4_4_;
              fVar80 = (fVar96 - (float)tray.org.field_0._8_4_) * (float)tray.rdir.field_0._8_4_;
              fVar81 = (fVar96 - (float)tray.org.field_0._12_4_) * (float)tray.rdir.field_0._12_4_;
              fVar82 = (fVar102 - (float)tray.org.field_0._16_4_) * (float)tray.rdir.field_0._16_4_;
              fVar85 = (fVar102 - (float)tray.org.field_0._20_4_) * (float)tray.rdir.field_0._20_4_;
              fVar86 = (fVar102 - (float)tray.org.field_0._24_4_) * (float)tray.rdir.field_0._24_4_;
              fVar87 = (fVar102 - (float)tray.org.field_0._28_4_) * (float)tray.rdir.field_0._28_4_;
              fVar96 = *(float *)(root.ptr + 0x60 + lVar27 * 4);
              fVar88 = (fVar96 - (float)tray.org.field_0._32_4_) * (float)tray.rdir.field_0._32_4_;
              fVar93 = (fVar96 - (float)tray.org.field_0._36_4_) * (float)tray.rdir.field_0._36_4_;
              fVar94 = (fVar96 - (float)tray.org.field_0._40_4_) * (float)tray.rdir.field_0._40_4_;
              fVar95 = (fVar96 - (float)tray.org.field_0._44_4_) * (float)tray.rdir.field_0._44_4_;
              fVar60 = (fVar100 - (float)tray.org.field_0._0_4_) * (float)tray.rdir.field_0._0_4_;
              fVar72 = (fVar100 - (float)tray.org.field_0._4_4_) * (float)tray.rdir.field_0._4_4_;
              fVar73 = (fVar100 - (float)tray.org.field_0._8_4_) * (float)tray.rdir.field_0._8_4_;
              fVar74 = (fVar100 - (float)tray.org.field_0._12_4_) * (float)tray.rdir.field_0._12_4_;
              fVar100 = (fVar105 - (float)tray.org.field_0._16_4_) * (float)tray.rdir.field_0._16_4_
              ;
              fVar102 = (fVar105 - (float)tray.org.field_0._20_4_) * (float)tray.rdir.field_0._20_4_
              ;
              fVar44 = (fVar105 - (float)tray.org.field_0._24_4_) * (float)tray.rdir.field_0._24_4_;
              fVar105 = (fVar105 - (float)tray.org.field_0._28_4_) * (float)tray.rdir.field_0._28_4_
              ;
              fVar96 = *(float *)(root.ptr + 0x70 + lVar27 * 4);
              fVar107 = (fVar96 - (float)tray.org.field_0._32_4_) * (float)tray.rdir.field_0._32_4_;
              fVar114 = (fVar96 - (float)tray.org.field_0._36_4_) * (float)tray.rdir.field_0._36_4_;
              fVar115 = (fVar96 - (float)tray.org.field_0._40_4_) * (float)tray.rdir.field_0._40_4_;
              fVar96 = (fVar96 - (float)tray.org.field_0._44_4_) * (float)tray.rdir.field_0._44_4_;
              uVar18 = (uint)((int)fVar60 < (int)fVar75) * (int)fVar60 |
                       (uint)((int)fVar60 >= (int)fVar75) * (int)fVar75;
              uVar19 = (uint)((int)fVar72 < (int)fVar79) * (int)fVar72 |
                       (uint)((int)fVar72 >= (int)fVar79) * (int)fVar79;
              uVar103 = (uint)((int)fVar73 < (int)fVar80) * (int)fVar73 |
                        (uint)((int)fVar73 >= (int)fVar80) * (int)fVar80;
              uVar106 = (uint)((int)fVar74 < (int)fVar81) * (int)fVar74 |
                        (uint)((int)fVar74 >= (int)fVar81) * (int)fVar81;
              uVar116 = (uint)((int)fVar100 < (int)fVar82) * (int)fVar100 |
                        (uint)((int)fVar100 >= (int)fVar82) * (int)fVar82;
              uVar118 = (uint)((int)fVar102 < (int)fVar85) * (int)fVar102 |
                        (uint)((int)fVar102 >= (int)fVar85) * (int)fVar85;
              uVar120 = (uint)((int)fVar44 < (int)fVar86) * (int)fVar44 |
                        (uint)((int)fVar44 >= (int)fVar86) * (int)fVar86;
              uVar122 = (uint)((int)fVar105 < (int)fVar87) * (int)fVar105 |
                        (uint)((int)fVar105 >= (int)fVar87) * (int)fVar87;
              uVar116 = ((int)uVar116 < (int)uVar18) * uVar18 |
                        ((int)uVar116 >= (int)uVar18) * uVar116;
              uVar118 = ((int)uVar118 < (int)uVar19) * uVar19 |
                        ((int)uVar118 >= (int)uVar19) * uVar118;
              uVar120 = ((int)uVar120 < (int)uVar103) * uVar103 |
                        ((int)uVar120 >= (int)uVar103) * uVar120;
              uVar122 = ((int)uVar122 < (int)uVar106) * uVar106 |
                        ((int)uVar122 >= (int)uVar106) * uVar122;
              uVar18 = (uint)((int)fVar107 < (int)fVar88) * (int)fVar107 |
                       (uint)((int)fVar107 >= (int)fVar88) * (int)fVar88;
              uVar19 = (uint)((int)fVar114 < (int)fVar93) * (int)fVar114 |
                       (uint)((int)fVar114 >= (int)fVar93) * (int)fVar93;
              uVar103 = (uint)((int)fVar115 < (int)fVar94) * (int)fVar115 |
                        (uint)((int)fVar115 >= (int)fVar94) * (int)fVar94;
              uVar106 = (uint)((int)fVar96 < (int)fVar95) * (int)fVar96 |
                        (uint)((int)fVar96 >= (int)fVar95) * (int)fVar95;
              auVar98._0_4_ =
                   ((int)uVar18 < (int)uVar116) * uVar116 | ((int)uVar18 >= (int)uVar116) * uVar18;
              auVar98._4_4_ =
                   ((int)uVar19 < (int)uVar118) * uVar118 | ((int)uVar19 >= (int)uVar118) * uVar19;
              auVar98._8_4_ =
                   ((int)uVar103 < (int)uVar120) * uVar120 |
                   ((int)uVar103 >= (int)uVar120) * uVar103;
              auVar98._12_4_ =
                   ((int)uVar106 < (int)uVar122) * uVar122 |
                   ((int)uVar106 >= (int)uVar122) * uVar106;
              uVar116 = (uint)((int)fVar60 < (int)fVar75) * (int)fVar75 |
                        (uint)((int)fVar60 >= (int)fVar75) * (int)fVar60;
              uVar118 = (uint)((int)fVar72 < (int)fVar79) * (int)fVar79 |
                        (uint)((int)fVar72 >= (int)fVar79) * (int)fVar72;
              uVar120 = (uint)((int)fVar73 < (int)fVar80) * (int)fVar80 |
                        (uint)((int)fVar73 >= (int)fVar80) * (int)fVar73;
              uVar122 = (uint)((int)fVar74 < (int)fVar81) * (int)fVar81 |
                        (uint)((int)fVar74 >= (int)fVar81) * (int)fVar74;
              uVar18 = (uint)((int)fVar100 < (int)fVar82) * (int)fVar82 |
                       (uint)((int)fVar100 >= (int)fVar82) * (int)fVar100;
              uVar19 = (uint)((int)fVar102 < (int)fVar85) * (int)fVar85 |
                       (uint)((int)fVar102 >= (int)fVar85) * (int)fVar102;
              uVar103 = (uint)((int)fVar44 < (int)fVar86) * (int)fVar86 |
                        (uint)((int)fVar44 >= (int)fVar86) * (int)fVar44;
              uVar106 = (uint)((int)fVar105 < (int)fVar87) * (int)fVar87 |
                        (uint)((int)fVar105 >= (int)fVar87) * (int)fVar105;
              uVar18 = ((int)uVar116 < (int)uVar18) * uVar116 |
                       ((int)uVar116 >= (int)uVar18) * uVar18;
              uVar19 = ((int)uVar118 < (int)uVar19) * uVar118 |
                       ((int)uVar118 >= (int)uVar19) * uVar19;
              uVar103 = ((int)uVar120 < (int)uVar103) * uVar120 |
                        ((int)uVar120 >= (int)uVar103) * uVar103;
              uVar106 = ((int)uVar122 < (int)uVar106) * uVar122 |
                        ((int)uVar122 >= (int)uVar106) * uVar106;
              uVar116 = (uint)((int)fVar107 < (int)fVar88) * (int)fVar88 |
                        (uint)((int)fVar107 >= (int)fVar88) * (int)fVar107;
              uVar118 = (uint)((int)fVar114 < (int)fVar93) * (int)fVar93 |
                        (uint)((int)fVar114 >= (int)fVar93) * (int)fVar114;
              uVar120 = (uint)((int)fVar115 < (int)fVar94) * (int)fVar94 |
                        (uint)((int)fVar115 >= (int)fVar94) * (int)fVar115;
              uVar122 = (uint)((int)fVar96 < (int)fVar95) * (int)fVar95 |
                        (uint)((int)fVar96 >= (int)fVar95) * (int)fVar96;
              uVar18 = ((int)uVar18 < (int)uVar116) * uVar18 |
                       ((int)uVar18 >= (int)uVar116) * uVar116;
              uVar19 = ((int)uVar19 < (int)uVar118) * uVar19 |
                       ((int)uVar19 >= (int)uVar118) * uVar118;
              uVar103 = ((int)uVar103 < (int)uVar120) * uVar103 |
                        ((int)uVar103 >= (int)uVar120) * uVar120;
              uVar106 = ((int)uVar106 < (int)uVar122) * uVar106 |
                        ((int)uVar106 >= (int)uVar122) * uVar122;
              auVar38._4_4_ =
                   -(uint)((float)((tray.tnear.field_0.i[1] < (int)auVar98._4_4_) * auVar98._4_4_ |
                                  (uint)(tray.tnear.field_0.i[1] >= (int)auVar98._4_4_) *
                                  tray.tnear.field_0.i[1]) <=
                          (float)((uint)(tray.tfar.field_0.i[1] < (int)uVar19) *
                                  tray.tfar.field_0.i[1] |
                                 (tray.tfar.field_0.i[1] >= (int)uVar19) * uVar19));
              auVar38._0_4_ =
                   -(uint)((float)((tray.tnear.field_0.i[0] < (int)auVar98._0_4_) * auVar98._0_4_ |
                                  (uint)(tray.tnear.field_0.i[0] >= (int)auVar98._0_4_) *
                                  tray.tnear.field_0.i[0]) <=
                          (float)((uint)(tray.tfar.field_0.i[0] < (int)uVar18) *
                                  tray.tfar.field_0.i[0] |
                                 (tray.tfar.field_0.i[0] >= (int)uVar18) * uVar18));
              auVar38._8_4_ =
                   -(uint)((float)((tray.tnear.field_0.i[2] < (int)auVar98._8_4_) * auVar98._8_4_ |
                                  (uint)(tray.tnear.field_0.i[2] >= (int)auVar98._8_4_) *
                                  tray.tnear.field_0.i[2]) <=
                          (float)((uint)(tray.tfar.field_0.i[2] < (int)uVar103) *
                                  tray.tfar.field_0.i[2] |
                                 (tray.tfar.field_0.i[2] >= (int)uVar103) * uVar103));
              auVar38._12_4_ =
                   -(uint)((float)((tray.tnear.field_0.i[3] < (int)auVar98._12_4_) * auVar98._12_4_
                                  | (uint)(tray.tnear.field_0.i[3] >= (int)auVar98._12_4_) *
                                    tray.tnear.field_0.i[3]) <=
                          (float)((uint)(tray.tfar.field_0.i[3] < (int)uVar106) *
                                  tray.tfar.field_0.i[3] |
                                 (tray.tfar.field_0.i[3] >= (int)uVar106) * uVar106));
              uVar18 = movmskps((int)this,auVar38);
              this = (BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::QuadMiIntersectorKMoeller<4,_4,_true>_>,_true>
                      *)(ulong)uVar18;
              uVar28 = uVar29;
              aVar62 = aVar48;
              if ((uVar18 != 0) &&
                 (auVar61._4_4_ = iVar144, auVar61._0_4_ = iVar25, auVar61._8_4_ = iVar145,
                 auVar61._12_4_ = iVar146,
                 aVar62 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                          blendvps(auVar61,auVar98,auVar38), uVar28 = uVar24, uVar29 != 8)) {
                pNVar33->ptr = uVar29;
                pNVar33 = pNVar33 + 1;
                *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar32->v = aVar48;
                paVar32 = paVar32 + 1;
              }
              aVar48 = aVar62;
              uVar29 = uVar28;
              lVar27 = lVar27 + 1;
            } while (lVar27 != 4);
            if (uVar29 == 8) goto LAB_00235c27;
            auVar39._4_4_ = -(uint)(aVar48.v[1] < tray.tfar.field_0.v[1]);
            auVar39._0_4_ = -(uint)(aVar48.v[0] < tray.tfar.field_0.v[0]);
            auVar39._8_4_ = -(uint)(aVar48.v[2] < tray.tfar.field_0.v[2]);
            auVar39._12_4_ = -(uint)(aVar48.v[3] < tray.tfar.field_0.v[3]);
            uVar20 = movmskps((uint)root.ptr,auVar39);
            uVar18 = POPCOUNT(uVar20);
            root.ptr = uVar29;
          } while ((byte)uVar31 < (byte)uVar18);
          pNVar33->ptr = uVar29;
          pNVar33 = pNVar33 + 1;
          *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar32->v = aVar48;
          paVar32 = paVar32 + 1;
LAB_00235c27:
          uVar18 = 4;
        }
        else {
          do {
            k = 0;
            if (uVar29 != 0) {
              for (; (uVar29 >> k & 1) == 0; k = k + 1) {
              }
            }
            tray_00 = &tray;
            this = (BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::QuadMiIntersectorKMoeller<4,_4,_true>_>,_true>
                    *)valid_i;
            bVar34 = occluded1((Intersectors *)valid_i,bvh,root,k,&pre,(RayK<4> *)This,tray_00,
                               (RayQueryContext *)ray);
            if (bVar34) {
              terminated.field_0.i[k] = -1;
            }
            uVar29 = uVar29 & uVar29 - 1;
          } while (uVar29 != 0);
          iVar25 = movmskps((int)tray_00,(undefined1  [16])terminated.field_0);
          uVar18 = 3;
          if (iVar25 != 0xf) {
            tray.tfar.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 blendvps((undefined1  [16])tray.tfar.field_0,_DAT_01f7aa00,
                          (undefined1  [16])terminated.field_0);
            uVar18 = 2;
          }
          iVar25 = 0x7f800000;
          iVar144 = 0x7f800000;
          iVar145 = 0x7f800000;
          iVar146 = 0x7f800000;
          if (uVar31 < uVar19) goto LAB_00234d87;
        }
      } while (uVar18 != 3);
LAB_00235d3a:
      auVar43._0_4_ = uVar45 & terminated.field_0.i[0];
      auVar43._4_4_ = uVar59 & terminated.field_0.i[1];
      auVar43._8_4_ = auVar46._8_4_ & terminated.field_0.i[2];
      auVar43._12_4_ = auVar46._12_4_ & terminated.field_0.i[3];
      auVar77 = blendvps(*(undefined1 (*) [16])&(This->intersector4_nofilter).name,_DAT_01f7aa00,
                         auVar43);
      *(undefined1 (*) [16])&(This->intersector4_nofilter).name = auVar77;
    }
  }
  return;
  while( true ) {
    uVar24 = uVar24 + 1;
    lVar27 = lVar27 + 0x60;
    auVar49 = auVar57;
    if (uVar29 - 8 <= uVar24) break;
LAB_00234f7a:
    lVar2 = *(long *)ray;
    uVar28 = 0;
    auVar77 = auVar49;
    while( true ) {
      uVar18 = *(uint *)(lVar27 + uVar28 * 4);
      uVar22 = (ulong)uVar18;
      if (uVar18 == 0xffffffff) break;
      uVar19 = *(uint *)(lVar27 + -0x10 + uVar28 * 4);
      lVar3 = *(long *)(*(long *)(lVar2 + 0x228) + (ulong)uVar19 * 8);
      uVar30 = (ulong)*(uint *)(lVar27 + -0x50 + uVar28 * 4);
      uVar22 = (ulong)*(uint *)(lVar27 + -0x40 + uVar28 * 4);
      fVar96 = *(float *)(lVar3 + uVar30 * 4);
      fVar100 = *(float *)(lVar3 + 4 + uVar30 * 4);
      fVar102 = *(float *)(lVar3 + 8 + uVar30 * 4);
      fVar105 = *(float *)(lVar3 + uVar22 * 4);
      fVar44 = *(float *)(lVar3 + 4 + uVar22 * 4);
      fVar60 = *(float *)(lVar3 + 8 + uVar22 * 4);
      uVar103 = *(uint *)(lVar27 + -0x20 + uVar28 * 4);
      uVar22 = (ulong)uVar103;
      fVar72 = *(float *)(lVar3 + uVar22 * 4);
      fVar73 = *(float *)(lVar3 + 4 + uVar22 * 4);
      fVar74 = *(float *)(lVar3 + 8 + uVar22 * 4);
      fVar132 = fVar73 - fVar100;
      fVar134 = fVar100 - fVar44;
      fVar108 = fVar74 - fVar102;
      fVar123 = fVar102 - fVar60;
      fVar127 = fVar123 * fVar132 - fVar134 * fVar108;
      fVar76 = fVar72 - fVar96;
      fVar83 = fVar96 - fVar105;
      auVar111._0_4_ = fVar108 * fVar83 - fVar123 * fVar76;
      auVar78._0_4_ = fVar76 * fVar134 - fVar132 * fVar83;
      fVar117 = fVar96 - *(float *)&This->ptr;
      fVar119 = fVar96 - *(float *)((long)&This->ptr + 4);
      fVar121 = fVar96 - *(float *)&This->leafIntersector;
      fVar96 = fVar96 - *(float *)((long)&This->leafIntersector + 4);
      fVar107 = fVar100 - *(float *)&(This->collider).collide;
      fVar114 = fVar100 - *(float *)((long)&(This->collider).collide + 4);
      fVar115 = fVar100 - *(float *)&(This->collider).name;
      fVar100 = fVar100 - *(float *)((long)&(This->collider).name + 4);
      fVar97 = fVar102 - *(float *)&(This->intersector1).intersect;
      fVar101 = fVar102 - *(float *)((long)&(This->intersector1).intersect + 4);
      fVar104 = fVar102 - *(float *)&(This->intersector1).occluded;
      fVar102 = fVar102 - *(float *)((long)&(This->intersector1).occluded + 4);
      fVar75 = *(float *)&(This->intersector4).name;
      fVar79 = *(float *)((long)&(This->intersector4).name + 4);
      fVar80 = *(float *)&(This->intersector4_filter).intersect;
      fVar81 = *(float *)((long)&(This->intersector4_filter).intersect + 4);
      fVar82 = *(float *)&(This->intersector4_filter).occluded;
      fVar85 = *(float *)((long)&(This->intersector4_filter).occluded + 4);
      fVar86 = *(float *)&(This->intersector4_filter).name;
      fVar87 = *(float *)((long)&(This->intersector4_filter).name + 4);
      fVar135 = fVar107 * fVar82 - fVar97 * fVar75;
      fVar139 = fVar114 * fVar85 - fVar101 * fVar79;
      fVar141 = fVar115 * fVar86 - fVar104 * fVar80;
      fVar143 = fVar100 * fVar87 - fVar102 * fVar81;
      fVar88 = *(float *)&(This->intersector4).intersect;
      fVar93 = *(float *)((long)&(This->intersector4).intersect + 4);
      fVar94 = *(float *)&(This->intersector4).occluded;
      fVar95 = *(float *)((long)&(This->intersector4).occluded + 4);
      fVar147 = fVar97 * fVar88 - fVar117 * fVar82;
      fVar148 = fVar101 * fVar93 - fVar119 * fVar85;
      fVar149 = fVar104 * fVar94 - fVar121 * fVar86;
      fVar150 = fVar102 * fVar95 - fVar96 * fVar87;
      fVar151 = fVar117 * fVar75 - fVar107 * fVar88;
      fVar154 = fVar119 * fVar79 - fVar114 * fVar93;
      fVar156 = fVar121 * fVar80 - fVar115 * fVar94;
      fVar158 = fVar96 * fVar81 - fVar100 * fVar95;
      auVar111._4_4_ = auVar111._0_4_;
      auVar111._8_4_ = auVar111._0_4_;
      auVar111._12_4_ = auVar111._0_4_;
      auVar78._4_4_ = auVar78._0_4_;
      auVar78._8_4_ = auVar78._0_4_;
      auVar78._12_4_ = auVar78._0_4_;
      fVar88 = fVar88 * fVar127 + fVar75 * auVar111._0_4_ + fVar82 * auVar78._0_4_;
      fVar93 = fVar93 * fVar127 + fVar79 * auVar111._0_4_ + fVar85 * auVar78._0_4_;
      fVar94 = fVar94 * fVar127 + fVar80 * auVar111._0_4_ + fVar86 * auVar78._0_4_;
      fVar87 = fVar95 * fVar127 + fVar81 * auVar111._0_4_ + fVar87 * auVar78._0_4_;
      uVar22 = (ulong)*(uint *)(lVar27 + -0x30 + uVar28 * 4);
      uVar106 = (uint)fVar88 & 0x80000000;
      uVar116 = (uint)fVar93 & 0x80000000;
      uVar118 = (uint)fVar94 & 0x80000000;
      uVar120 = (uint)fVar87 & 0x80000000;
      fVar81 = (float)((uint)(fVar76 * fVar135 + fVar132 * fVar147 + fVar108 * fVar151) ^ uVar106);
      fVar82 = (float)((uint)(fVar76 * fVar139 + fVar132 * fVar148 + fVar108 * fVar154) ^ uVar116);
      fVar85 = (float)((uint)(fVar76 * fVar141 + fVar132 * fVar149 + fVar108 * fVar156) ^ uVar118);
      fVar86 = (float)((uint)(fVar76 * fVar143 + fVar132 * fVar150 + fVar108 * fVar158) ^ uVar120);
      auVar63._0_4_ = -(uint)(0.0 <= fVar81) & auVar77._0_4_;
      auVar63._4_4_ = -(uint)(0.0 <= fVar82) & auVar77._4_4_;
      auVar63._8_4_ = -(uint)(0.0 <= fVar85) & auVar77._8_4_;
      auVar63._12_4_ = -(uint)(0.0 <= fVar86) & auVar77._12_4_;
      uVar103 = movmskps(uVar103,auVar63);
      this = (BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::QuadMiIntersectorKMoeller<4,_4,_true>_>,_true>
              *)(ulong)uVar103;
      fVar75 = *(float *)(lVar3 + uVar22 * 4);
      fVar79 = *(float *)(lVar3 + 4 + uVar22 * 4);
      fVar80 = *(float *)(lVar3 + 8 + uVar22 * 4);
      if (uVar103 != 0) {
        fVar95 = (float)((uint)(fVar83 * fVar135 + fVar134 * fVar147 + fVar123 * fVar151) ^ uVar106)
        ;
        fVar76 = (float)((uint)(fVar83 * fVar139 + fVar134 * fVar148 + fVar123 * fVar154) ^ uVar116)
        ;
        fVar108 = (float)((uint)(fVar83 * fVar141 + fVar134 * fVar149 + fVar123 * fVar156) ^ uVar118
                         );
        fVar83 = (float)((uint)(fVar83 * fVar143 + fVar134 * fVar150 + fVar123 * fVar158) ^ uVar120)
        ;
        auVar137._0_4_ = -(uint)(0.0 <= fVar95) & auVar63._0_4_;
        auVar137._4_4_ = -(uint)(0.0 <= fVar76) & auVar63._4_4_;
        auVar137._8_4_ = -(uint)(0.0 <= fVar108) & auVar63._8_4_;
        auVar137._12_4_ = -(uint)(0.0 <= fVar83) & auVar63._12_4_;
        iVar25 = movmskps((int)lVar3,auVar137);
        if (iVar25 != 0) {
          fVar123 = ABS(fVar88);
          fVar132 = ABS(fVar93);
          auVar91._0_8_ = CONCAT44(fVar93,fVar88) & 0x7fffffff7fffffff;
          auVar91._8_4_ = ABS(fVar94);
          auVar91._12_4_ = ABS(fVar87);
          auVar64._0_4_ = -(uint)(fVar95 <= fVar123 - fVar81) & auVar137._0_4_;
          auVar64._4_4_ = -(uint)(fVar76 <= fVar132 - fVar82) & auVar137._4_4_;
          auVar64._8_4_ = -(uint)(fVar108 <= auVar91._8_4_ - fVar85) & auVar137._8_4_;
          auVar64._12_4_ = -(uint)(fVar83 <= auVar91._12_4_ - fVar86) & auVar137._12_4_;
          iVar25 = movmskps(iVar25,auVar64);
          if (iVar25 != 0) {
            fVar107 = (float)(uVar106 ^
                             (uint)(fVar117 * fVar127 +
                                   fVar107 * auVar111._0_4_ + fVar97 * auVar78._0_4_));
            fVar114 = (float)(uVar116 ^
                             (uint)(fVar119 * fVar127 +
                                   fVar114 * auVar111._0_4_ + fVar101 * auVar78._0_4_));
            fVar115 = (float)(uVar118 ^
                             (uint)(fVar121 * fVar127 +
                                   fVar115 * auVar111._0_4_ + fVar104 * auVar78._0_4_));
            fVar96 = (float)(uVar120 ^
                            (uint)(fVar96 * fVar127 +
                                  fVar100 * auVar111._0_4_ + fVar102 * auVar78._0_4_));
            ppcVar1 = &(This->intersector4_nofilter).name;
            auVar71 = *(undefined1 (*) [16])ppcVar1;
            auVar41._0_4_ =
                 -(uint)(fVar107 <= fVar123 * *(float *)ppcVar1 &&
                        *(float *)&(This->intersector1).pointQuery * fVar123 < fVar107) &
                 auVar64._0_4_;
            auVar41._4_4_ =
                 -(uint)(fVar114 <=
                         fVar132 * *(float *)((long)&(This->intersector4_nofilter).name + 4) &&
                        *(float *)((long)&(This->intersector1).pointQuery + 4) * fVar132 < fVar114)
                 & auVar64._4_4_;
            auVar41._8_4_ =
                 -(uint)(fVar115 <= auVar91._8_4_ * *(float *)&(This->intersector8).intersect &&
                        *(float *)&(This->intersector1).name * auVar91._8_4_ < fVar115) &
                 auVar64._8_4_;
            auVar41._12_4_ =
                 -(uint)(fVar96 <= auVar91._12_4_ *
                                   *(float *)((long)&(This->intersector8).intersect + 4) &&
                        *(float *)((long)&(This->intersector1).name + 4) * auVar91._12_4_ < fVar96)
                 & auVar64._12_4_;
            iVar25 = movmskps(iVar25,auVar41);
            if (iVar25 != 0) {
              uVar103 = -(uint)(fVar88 != 0.0) & auVar41._0_4_;
              uVar106 = -(uint)(fVar93 != 0.0) & auVar41._4_4_;
              uVar116 = -(uint)(fVar94 != 0.0) & auVar41._8_4_;
              uVar118 = -(uint)(fVar87 != 0.0) & auVar41._12_4_;
              auVar10._4_4_ = uVar106;
              auVar10._0_4_ = uVar103;
              auVar10._8_4_ = uVar116;
              auVar10._12_4_ = uVar118;
              iVar25 = movmskps(iVar25,auVar10);
              if (iVar25 != 0) {
                lVar3 = *(long *)(*(long *)(*(long *)ray + 0x1e8) + (ulong)uVar19 * 8);
                uVar120 = *(uint *)(lVar3 + 0x34);
                auVar50._0_4_ = -(uint)((uVar120 & *(uint *)&(This->intersector8).occluded) == 0);
                auVar50._4_4_ =
                     -(uint)((uVar120 & *(uint *)((long)&(This->intersector8).occluded + 4)) == 0);
                auVar50._8_4_ = -(uint)((uVar120 & *(uint *)&(This->intersector8).name) == 0);
                auVar50._12_4_ =
                     -(uint)((uVar120 & *(uint *)((long)&(This->intersector8).name + 4)) == 0);
                auVar11._4_4_ = uVar106;
                auVar11._0_4_ = uVar103;
                auVar11._8_4_ = uVar116;
                auVar11._12_4_ = uVar118;
                auVar51 = ~auVar50 & auVar11;
                iVar25 = movmskps((int)lVar3,auVar51);
                if (iVar25 != 0) {
                  if ((*(long *)(*(long *)(ray + 0x10) + 0x10) != 0) ||
                     (*(long *)(lVar3 + 0x48) != 0)) {
                    auVar36 = rcpps(ZEXT416(uVar120),auVar91);
                    fVar100 = auVar36._0_4_;
                    fVar102 = auVar36._4_4_;
                    fVar87 = auVar36._8_4_;
                    fVar88 = auVar36._12_4_;
                    fVar93 = (float)DAT_01f7ba10;
                    fVar94 = DAT_01f7ba10._4_4_;
                    fVar97 = DAT_01f7ba10._12_4_;
                    fVar101 = DAT_01f7ba10._8_4_;
                    fVar100 = (fVar93 - fVar123 * fVar100) * fVar100 + fVar100;
                    fVar102 = (fVar94 - fVar132 * fVar102) * fVar102 + fVar102;
                    fVar87 = (fVar101 - auVar91._8_4_ * fVar87) * fVar87 + fVar87;
                    fVar88 = (fVar97 - auVar91._12_4_ * fVar88) * fVar88 + fVar88;
                    auVar92._0_4_ = fVar81 * fVar100;
                    auVar92._4_4_ = fVar82 * fVar102;
                    auVar92._8_4_ = fVar85 * fVar87;
                    auVar92._12_4_ = fVar86 * fVar88;
                    auVar36 = minps(auVar92,_DAT_01f7ba10);
                    auVar138._0_4_ = fVar95 * fVar100;
                    auVar138._4_4_ = fVar76 * fVar102;
                    auVar138._8_4_ = fVar108 * fVar87;
                    auVar138._12_4_ = fVar83 * fVar88;
                    auVar47 = minps(auVar138,_DAT_01f7ba10);
                    auVar65._0_4_ = fVar93 - auVar36._0_4_;
                    auVar65._4_4_ = fVar94 - auVar36._4_4_;
                    auVar65._8_4_ = fVar101 - auVar36._8_4_;
                    auVar65._12_4_ = fVar97 - auVar36._12_4_;
                    auVar84._0_4_ = fVar93 - auVar47._0_4_;
                    auVar84._4_4_ = fVar94 - auVar47._4_4_;
                    auVar84._8_4_ = fVar101 - auVar47._8_4_;
                    auVar84._12_4_ = fVar97 - auVar47._12_4_;
                    auVar13._8_8_ = uVar15;
                    auVar13._0_8_ = uVar14;
                    local_1848 = blendvps(auVar36,auVar65,auVar13);
                    local_1838 = blendvps(auVar47,auVar84,auVar13);
                    local_1878 = CONCAT44(fVar127,fVar127);
                    uStack_1870 = CONCAT44(fVar127,fVar127);
                    local_1828._4_4_ = uVar18;
                    local_1828._0_4_ = uVar18;
                    local_1828._8_4_ = uVar18;
                    local_1828._12_4_ = uVar18;
                    auVar99._0_4_ = fVar100 * fVar107;
                    auVar99._4_4_ = fVar102 * fVar114;
                    auVar99._8_4_ = fVar87 * fVar115;
                    auVar99._12_4_ = fVar88 * fVar96;
                    local_1808 = **(undefined4 **)(ray + 8);
                    local_17f8 = (*(undefined4 **)(ray + 8))[1];
                    auVar36 = blendvps(*(undefined1 (*) [16])ppcVar1,auVar99,auVar51);
                    *(undefined1 (*) [16])&(This->intersector4_nofilter).name = auVar36;
                    args.valid = (int *)local_1968;
                    args.geometryUserPtr = *(void **)(lVar3 + 0x18);
                    args.context = *(RTCRayQueryContext **)(ray + 8);
                    args.hit = (RTCHitN *)&local_1878;
                    args.N = 4;
                    pRVar23 = *(RTCRayN **)(lVar3 + 0x48);
                    local_1968 = auVar51;
                    args.ray = (RTCRayN *)This;
                    local_1868 = auVar111;
                    local_1858 = auVar78;
                    local_1818 = uVar19;
                    uStack_1814 = uVar19;
                    uStack_1810 = uVar19;
                    uStack_180c = uVar19;
                    uStack_1804 = local_1808;
                    uStack_1800 = local_1808;
                    uStack_17fc = local_1808;
                    uStack_17f4 = local_17f8;
                    uStack_17f0 = local_17f8;
                    uStack_17ec = local_17f8;
                    if (pRVar23 != (RTCRayN *)0x0) {
                      this = (BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::QuadMiIntersectorKMoeller<4,_4,_true>_>,_true>
                              *)&args;
                      pRVar23 = (RTCRayN *)(*(code *)pRVar23)();
                    }
                    if (local_1968 == (undefined1  [16])0x0) {
                      auVar66._8_4_ = 0xffffffff;
                      auVar66._0_8_ = 0xffffffffffffffff;
                      auVar66._12_4_ = 0xffffffff;
                      auVar66 = auVar66 ^ _DAT_01f7ae20;
                    }
                    else {
                      pcVar4 = *(code **)(*(byte **)(ray + 0x10) + 0x10);
                      if ((pcVar4 != (code *)0x0) &&
                         (((**(byte **)(ray + 0x10) & 2) != 0 ||
                          ((*(byte *)(lVar3 + 0x3e) & 0x40) != 0)))) {
                        this = (BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::QuadMiIntersectorKMoeller<4,_4,_true>_>,_true>
                                *)&args;
                        (*pcVar4)();
                      }
                      auVar55._0_4_ = -(uint)(local_1968._0_4_ == 0);
                      auVar55._4_4_ = -(uint)(local_1968._4_4_ == 0);
                      auVar55._8_4_ = -(uint)(local_1968._8_4_ == 0);
                      auVar55._12_4_ = -(uint)(local_1968._12_4_ == 0);
                      auVar66 = auVar55 ^ _DAT_01f7ae20;
                      auVar36 = blendvps(_DAT_01f7aa00,*(undefined1 (*) [16])(args.ray + 0x80),
                                         auVar55);
                      *(undefined1 (*) [16])(args.ray + 0x80) = auVar36;
                      pRVar23 = args.ray;
                    }
                    uVar18 = (uint)pRVar23;
                    auVar69._0_4_ = auVar66._0_4_ << 0x1f;
                    auVar69._4_4_ = auVar66._4_4_ << 0x1f;
                    auVar69._8_4_ = auVar66._8_4_ << 0x1f;
                    auVar69._12_4_ = auVar66._12_4_ << 0x1f;
                    auVar51._0_4_ = auVar69._0_4_ >> 0x1f;
                    auVar51._4_4_ = auVar69._4_4_ >> 0x1f;
                    auVar51._8_4_ = auVar69._8_4_ >> 0x1f;
                    auVar51._12_4_ = auVar69._12_4_ >> 0x1f;
                    auVar71 = blendvps(auVar71,*(undefined1 (*) [16])
                                                &(This->intersector4_nofilter).name,auVar69);
                    *(undefined1 (*) [16])&(This->intersector4_nofilter).name = auVar71;
                  }
                  auVar77 = ~auVar51 & auVar77;
                }
              }
            }
          }
        }
      }
      iVar146 = 0x7f800000;
      iVar145 = 0x7f800000;
      iVar144 = 0x7f800000;
      iVar25 = 0x7f800000;
      uVar18 = movmskps(uVar18,auVar77);
      uVar22 = (ulong)uVar18;
      if (uVar18 == 0) break;
      fVar139 = fVar75 - fVar72;
      fVar143 = fVar75 - fVar72;
      fVar148 = fVar75 - fVar72;
      fVar72 = fVar75 - fVar72;
      fVar151 = fVar79 - fVar73;
      fVar156 = fVar79 - fVar73;
      fVar124 = fVar79 - fVar73;
      fVar73 = fVar79 - fVar73;
      fVar121 = fVar80 - fVar74;
      fVar123 = fVar80 - fVar74;
      fVar127 = fVar80 - fVar74;
      fVar74 = fVar80 - fVar74;
      fVar152 = fVar105 - fVar75;
      fVar155 = fVar105 - fVar75;
      fVar157 = fVar105 - fVar75;
      fVar105 = fVar105 - fVar75;
      fVar97 = fVar44 - fVar79;
      fVar101 = fVar44 - fVar79;
      fVar104 = fVar44 - fVar79;
      fVar44 = fVar44 - fVar79;
      fVar108 = fVar60 - fVar80;
      fVar117 = fVar60 - fVar80;
      fVar119 = fVar60 - fVar80;
      fVar60 = fVar60 - fVar80;
      fVar107 = fVar97 * fVar121 - fVar108 * fVar151;
      fVar114 = fVar101 * fVar123 - fVar117 * fVar156;
      uStack_18c0._0_4_ = fVar104 * fVar127 - fVar119 * fVar124;
      uStack_18c0._4_4_ = fVar44 * fVar74 - fVar60 * fVar73;
      auVar90._0_4_ = fVar108 * fVar139 - fVar152 * fVar121;
      auVar90._4_4_ = fVar117 * fVar143 - fVar155 * fVar123;
      auVar90._8_4_ = fVar119 * fVar148 - fVar157 * fVar127;
      auVar90._12_4_ = fVar60 * fVar72 - fVar105 * fVar74;
      local_18d8._0_4_ = fVar152 * fVar151 - fVar97 * fVar139;
      local_18d8._4_4_ = fVar155 * fVar156 - fVar101 * fVar143;
      fStack_18d0 = fVar157 * fVar124 - fVar104 * fVar148;
      fStack_18cc = fVar105 * fVar73 - fVar44 * fVar72;
      fVar115 = fVar75 - *(float *)&This->ptr;
      fVar76 = fVar75 - *(float *)((long)&This->ptr + 4);
      fVar83 = fVar75 - *(float *)&This->leafIntersector;
      fVar75 = fVar75 - *(float *)((long)&This->leafIntersector + 4);
      fVar136 = fVar79 - *(float *)&(This->collider).collide;
      fVar140 = fVar79 - *(float *)((long)&(This->collider).collide + 4);
      fVar142 = fVar79 - *(float *)&(This->collider).name;
      fVar79 = fVar79 - *(float *)((long)&(This->collider).name + 4);
      fVar132 = fVar80 - *(float *)&(This->intersector1).intersect;
      fVar134 = fVar80 - *(float *)((long)&(This->intersector1).intersect + 4);
      fVar135 = fVar80 - *(float *)&(This->intersector1).occluded;
      fVar80 = fVar80 - *(float *)((long)&(This->intersector1).occluded + 4);
      fVar96 = *(float *)&(This->intersector4).intersect;
      fVar100 = *(float *)((long)&(This->intersector4).intersect + 4);
      fVar102 = *(float *)&(This->intersector4).occluded;
      fVar81 = *(float *)((long)&(This->intersector4).occluded + 4);
      fVar82 = *(float *)&(This->intersector4).name;
      fVar85 = *(float *)((long)&(This->intersector4).name + 4);
      fVar86 = *(float *)&(This->intersector4_filter).intersect;
      fVar87 = *(float *)((long)&(This->intersector4_filter).intersect + 4);
      fVar88 = *(float *)&(This->intersector4_filter).occluded;
      fVar93 = *(float *)((long)&(This->intersector4_filter).occluded + 4);
      fVar94 = *(float *)&(This->intersector4_filter).name;
      fVar95 = *(float *)((long)&(This->intersector4_filter).name + 4);
      fVar141 = fVar136 * fVar88 - fVar132 * fVar82;
      fVar147 = fVar140 * fVar93 - fVar134 * fVar85;
      fVar149 = fVar142 * fVar94 - fVar135 * fVar86;
      fVar150 = fVar79 * fVar95 - fVar80 * fVar87;
      fVar154 = fVar132 * fVar96 - fVar115 * fVar88;
      fVar158 = fVar134 * fVar100 - fVar76 * fVar93;
      fVar125 = fVar135 * fVar102 - fVar83 * fVar94;
      fVar126 = fVar80 * fVar81 - fVar75 * fVar95;
      fVar128 = fVar115 * fVar82 - fVar136 * fVar96;
      fVar129 = fVar76 * fVar85 - fVar140 * fVar100;
      fVar130 = fVar83 * fVar86 - fVar142 * fVar102;
      fVar131 = fVar75 * fVar87 - fVar79 * fVar81;
      fVar96 = fVar96 * fVar107 + fVar82 * auVar90._0_4_ + fVar88 * (float)local_18d8._0_4_;
      fVar100 = fVar100 * fVar114 + fVar85 * auVar90._4_4_ + fVar93 * (float)local_18d8._4_4_;
      fVar102 = fVar102 * (float)uStack_18c0 + fVar86 * auVar90._8_4_ + fVar94 * fStack_18d0;
      fVar81 = fVar81 * uStack_18c0._4_4_ + fVar87 * auVar90._12_4_ + fVar95 * fStack_18cc;
      uVar19 = (uint)fVar96 & 0x80000000;
      uVar103 = (uint)fVar100 & 0x80000000;
      uVar106 = (uint)fVar102 & 0x80000000;
      uVar116 = (uint)fVar81 & 0x80000000;
      fVar82 = (float)((uint)(fVar152 * fVar141 + fVar97 * fVar154 + fVar108 * fVar128) ^ uVar19);
      fVar85 = (float)((uint)(fVar155 * fVar147 + fVar101 * fVar158 + fVar117 * fVar129) ^ uVar103);
      fVar86 = (float)((uint)(fVar157 * fVar149 + fVar104 * fVar125 + fVar119 * fVar130) ^ uVar106);
      fVar105 = (float)((uint)(fVar105 * fVar150 + fVar44 * fVar126 + fVar60 * fVar131) ^ uVar116);
      uVar118 = -(uint)(0.0 <= fVar82) & auVar77._0_4_;
      uVar120 = -(uint)(0.0 <= fVar85) & auVar77._4_4_;
      uVar122 = -(uint)(0.0 <= fVar86) & auVar77._8_4_;
      uVar133 = -(uint)(0.0 <= fVar105) & auVar77._12_4_;
      auVar9._4_4_ = uVar120;
      auVar9._0_4_ = uVar118;
      auVar9._8_4_ = uVar122;
      auVar9._12_4_ = uVar133;
      uVar18 = movmskps(uVar18,auVar9);
      if (uVar18 != 0) {
        local_18c8 = CONCAT44(fVar114,fVar107);
        fVar44 = (float)((uint)(fVar139 * fVar141 + fVar151 * fVar154 + fVar121 * fVar128) ^ uVar19)
        ;
        fVar60 = (float)((uint)(fVar143 * fVar147 + fVar156 * fVar158 + fVar123 * fVar129) ^ uVar103
                        );
        fVar87 = (float)((uint)(fVar148 * fVar149 + fVar124 * fVar125 + fVar127 * fVar130) ^ uVar106
                        );
        fVar72 = (float)((uint)(fVar72 * fVar150 + fVar73 * fVar126 + fVar74 * fVar131) ^ uVar116);
        uVar118 = -(uint)(0.0 <= fVar44) & uVar118;
        uVar120 = -(uint)(0.0 <= fVar60) & uVar120;
        uVar122 = -(uint)(0.0 <= fVar87) & uVar122;
        uVar133 = -(uint)(0.0 <= fVar72) & uVar133;
        auVar5._4_4_ = uVar120;
        auVar5._0_4_ = uVar118;
        auVar5._8_4_ = uVar122;
        auVar5._12_4_ = uVar133;
        uVar18 = movmskps(uVar18,auVar5);
        if (uVar18 != 0) {
          fVar73 = ABS(fVar96);
          fVar74 = ABS(fVar100);
          auVar112._0_8_ = CONCAT44(fVar100,fVar96) & 0x7fffffff7fffffff;
          auVar112._8_4_ = ABS(fVar102);
          auVar112._12_4_ = ABS(fVar81);
          auVar52._0_4_ = -(uint)(fVar44 <= fVar73 - fVar82) & uVar118;
          auVar52._4_4_ = -(uint)(fVar60 <= fVar74 - fVar85) & uVar120;
          auVar52._8_4_ = -(uint)(fVar87 <= auVar112._8_4_ - fVar86) & uVar122;
          auVar52._12_4_ = -(uint)(fVar72 <= auVar112._12_4_ - fVar105) & uVar133;
          uVar18 = movmskps(uVar18,auVar52);
          if (uVar18 != 0) {
            fVar88 = (float)(uVar19 ^ (uint)(fVar115 * fVar107 +
                                            fVar136 * auVar90._0_4_ +
                                            fVar132 * (float)local_18d8._0_4_));
            fVar93 = (float)(uVar103 ^
                            (uint)(fVar76 * fVar114 +
                                  fVar140 * auVar90._4_4_ + fVar134 * (float)local_18d8._4_4_));
            fVar94 = (float)(uVar106 ^
                            (uint)(fVar83 * (float)uStack_18c0 +
                                  fVar142 * auVar90._8_4_ + fVar135 * fStack_18d0));
            fVar75 = (float)(uVar116 ^
                            (uint)(fVar75 * uStack_18c0._4_4_ +
                                  fVar79 * auVar90._12_4_ + fVar80 * fStack_18cc));
            auVar71 = *(undefined1 (*) [16])&(This->intersector4_nofilter).name;
            uVar19 = -(uint)(fVar88 <= fVar73 * auVar71._0_4_ &&
                            *(float *)&(This->intersector1).pointQuery * fVar73 < fVar88) &
                     auVar52._0_4_;
            uVar103 = -(uint)(fVar93 <= fVar74 * auVar71._4_4_ &&
                             *(float *)((long)&(This->intersector1).pointQuery + 4) * fVar74 <
                             fVar93) & auVar52._4_4_;
            uVar106 = -(uint)(fVar94 <= auVar112._8_4_ * auVar71._8_4_ &&
                             *(float *)&(This->intersector1).name * auVar112._8_4_ < fVar94) &
                      auVar52._8_4_;
            uVar116 = -(uint)(fVar75 <= auVar112._12_4_ * auVar71._12_4_ &&
                             *(float *)((long)&(This->intersector1).name + 4) * auVar112._12_4_ <
                             fVar75) & auVar52._12_4_;
            auVar6._4_4_ = uVar103;
            auVar6._0_4_ = uVar19;
            auVar6._8_4_ = uVar106;
            auVar6._12_4_ = uVar116;
            uVar18 = movmskps(uVar18,auVar6);
            if (uVar18 != 0) {
              auVar42._0_4_ = -(uint)(fVar96 != 0.0) & uVar19;
              auVar42._4_4_ = -(uint)(fVar100 != 0.0) & uVar103;
              auVar42._8_4_ = -(uint)(fVar102 != 0.0) & uVar106;
              auVar42._12_4_ = -(uint)(fVar81 != 0.0) & uVar116;
              uVar18 = movmskps(uVar18,auVar42);
              if (uVar18 != 0) {
                uVar18 = *(uint *)(lVar27 + -0x10 + uVar28 * 4);
                lVar3 = *(long *)(*(long *)(*(long *)ray + 0x1e8) + (ulong)uVar18 * 8);
                uVar19 = *(uint *)(lVar3 + 0x34);
                auVar53._0_4_ = -(uint)((uVar19 & *(uint *)&(This->intersector8).occluded) == 0);
                auVar53._4_4_ =
                     -(uint)((uVar19 & *(uint *)((long)&(This->intersector8).occluded + 4)) == 0);
                auVar53._8_4_ = -(uint)((uVar19 & *(uint *)&(This->intersector8).name) == 0);
                auVar53._12_4_ =
                     -(uint)((uVar19 & *(uint *)((long)&(This->intersector8).name + 4)) == 0);
                auVar54 = ~auVar53 & auVar42;
                iVar25 = movmskps((int)lVar3,auVar54);
                if (iVar25 != 0) {
                  uVar20 = *(undefined4 *)(lVar27 + uVar28 * 4);
                  if ((*(long *)(*(long *)(ray + 0x10) + 0x10) != 0) ||
                     (*(long *)(lVar3 + 0x48) != 0)) {
                    auVar36 = rcpps(auVar42,auVar112);
                    fVar96 = auVar36._0_4_;
                    fVar100 = auVar36._4_4_;
                    fVar102 = auVar36._8_4_;
                    fVar79 = auVar36._12_4_;
                    fVar80 = (float)DAT_01f7ba10;
                    fVar81 = DAT_01f7ba10._4_4_;
                    fVar95 = DAT_01f7ba10._8_4_;
                    fVar107 = DAT_01f7ba10._12_4_;
                    fVar96 = (fVar80 - fVar73 * fVar96) * fVar96 + fVar96;
                    fVar100 = (fVar81 - fVar74 * fVar100) * fVar100 + fVar100;
                    fVar102 = (fVar95 - auVar112._8_4_ * fVar102) * fVar102 + fVar102;
                    fVar79 = (fVar107 - auVar112._12_4_ * fVar79) * fVar79 + fVar79;
                    auVar153._0_4_ = fVar82 * fVar96;
                    auVar153._4_4_ = fVar85 * fVar100;
                    auVar153._8_4_ = fVar86 * fVar102;
                    auVar153._12_4_ = fVar105 * fVar79;
                    auVar47 = minps(auVar153,_DAT_01f7ba10);
                    auVar67._0_4_ = fVar44 * fVar96;
                    auVar67._4_4_ = fVar60 * fVar100;
                    auVar67._8_4_ = fVar87 * fVar102;
                    auVar67._12_4_ = fVar72 * fVar79;
                    auVar36 = minps(auVar67,_DAT_01f7ba10);
                    auVar113._0_4_ = fVar80 - auVar47._0_4_;
                    auVar113._4_4_ = fVar81 - auVar47._4_4_;
                    auVar113._8_4_ = fVar95 - auVar47._8_4_;
                    auVar113._12_4_ = fVar107 - auVar47._12_4_;
                    auVar12._8_8_ = uVar17;
                    auVar12._0_8_ = uVar16;
                    local_1848 = blendvps(auVar47,auVar113,auVar12);
                    auVar8._4_4_ = fVar81 - auVar36._4_4_;
                    auVar8._0_4_ = fVar80 - auVar36._0_4_;
                    auVar8._8_4_ = fVar95 - auVar36._8_4_;
                    auVar8._12_4_ = fVar107 - auVar36._12_4_;
                    local_1838 = blendvps(auVar36,auVar8,auVar12);
                    local_1828._4_4_ = uVar20;
                    local_1828._0_4_ = uVar20;
                    local_1828._8_4_ = uVar20;
                    local_1828._12_4_ = uVar20;
                    local_1878 = local_18c8;
                    uStack_1870 = uStack_18c0;
                    local_1858 = _local_18d8;
                    local_1808 = **(undefined4 **)(ray + 8);
                    local_17f8 = (*(undefined4 **)(ray + 8))[1];
                    auVar7._4_4_ = fVar100 * fVar93;
                    auVar7._0_4_ = fVar96 * fVar88;
                    auVar7._8_4_ = fVar102 * fVar94;
                    auVar7._12_4_ = fVar79 * fVar75;
                    auVar36 = blendvps(auVar71,auVar7,auVar54);
                    *(undefined1 (*) [16])&(This->intersector4_nofilter).name = auVar36;
                    args.valid = (int *)local_1968;
                    args.geometryUserPtr = *(void **)(lVar3 + 0x18);
                    args.context = *(RTCRayQueryContext **)(ray + 8);
                    args.hit = (RTCHitN *)&local_1878;
                    args.N = 4;
                    pRVar23 = *(RTCRayN **)(lVar3 + 0x48);
                    local_1968 = auVar54;
                    args.ray = (RTCRayN *)This;
                    local_1868 = auVar90;
                    local_1818 = uVar18;
                    uStack_1814 = uVar18;
                    uStack_1810 = uVar18;
                    uStack_180c = uVar18;
                    uStack_1804 = local_1808;
                    uStack_1800 = local_1808;
                    uStack_17fc = local_1808;
                    uStack_17f4 = local_17f8;
                    uStack_17f0 = local_17f8;
                    uStack_17ec = local_17f8;
                    if (pRVar23 != (RTCRayN *)0x0) {
                      this = (BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::QuadMiIntersectorKMoeller<4,_4,_true>_>,_true>
                              *)&args;
                      pRVar23 = (RTCRayN *)(*(code *)pRVar23)();
                    }
                    if (local_1968 == (undefined1  [16])0x0) {
                      auVar68._8_4_ = 0xffffffff;
                      auVar68._0_8_ = 0xffffffffffffffff;
                      auVar68._12_4_ = 0xffffffff;
                      auVar68 = auVar68 ^ _DAT_01f7ae20;
                    }
                    else {
                      pcVar4 = *(code **)(*(byte **)(ray + 0x10) + 0x10);
                      if ((pcVar4 != (code *)0x0) &&
                         (((**(byte **)(ray + 0x10) & 2) != 0 ||
                          ((*(byte *)(lVar3 + 0x3e) & 0x40) != 0)))) {
                        this = (BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::QuadMiIntersectorKMoeller<4,_4,_true>_>,_true>
                                *)&args;
                        (*pcVar4)();
                      }
                      auVar56._0_4_ = -(uint)(local_1968._0_4_ == 0);
                      auVar56._4_4_ = -(uint)(local_1968._4_4_ == 0);
                      auVar56._8_4_ = -(uint)(local_1968._8_4_ == 0);
                      auVar56._12_4_ = -(uint)(local_1968._12_4_ == 0);
                      auVar68 = auVar56 ^ _DAT_01f7ae20;
                      auVar36 = blendvps(_DAT_01f7aa00,*(undefined1 (*) [16])(args.ray + 0x80),
                                         auVar56);
                      *(undefined1 (*) [16])(args.ray + 0x80) = auVar36;
                      pRVar23 = args.ray;
                    }
                    uVar18 = (uint)pRVar23;
                    auVar70._0_4_ = auVar68._0_4_ << 0x1f;
                    auVar70._4_4_ = auVar68._4_4_ << 0x1f;
                    auVar70._8_4_ = auVar68._8_4_ << 0x1f;
                    auVar70._12_4_ = auVar68._12_4_ << 0x1f;
                    auVar54._0_4_ = auVar70._0_4_ >> 0x1f;
                    auVar54._4_4_ = auVar70._4_4_ >> 0x1f;
                    auVar54._8_4_ = auVar70._8_4_ >> 0x1f;
                    auVar54._12_4_ = auVar70._12_4_ >> 0x1f;
                    auVar71 = blendvps(auVar71,*(undefined1 (*) [16])
                                                &(This->intersector4_nofilter).name,auVar70);
                    *(undefined1 (*) [16])&(This->intersector4_nofilter).name = auVar71;
                  }
                  auVar77 = ~auVar54 & auVar77;
                }
              }
            }
          }
        }
      }
      iVar146 = 0x7f800000;
      iVar145 = 0x7f800000;
      iVar144 = 0x7f800000;
      iVar25 = 0x7f800000;
      uVar18 = movmskps(uVar18,auVar77);
      uVar22 = (ulong)uVar18;
      if ((uVar18 == 0) || (uVar22 = uVar28 + 1, bVar34 = 2 < uVar28, uVar28 = uVar22, bVar34))
      break;
    }
    auVar57._0_4_ = auVar49._0_4_ & auVar77._0_4_;
    auVar57._4_4_ = auVar49._4_4_ & auVar77._4_4_;
    auVar57._8_4_ = auVar49._8_4_ & auVar77._8_4_;
    auVar57._12_4_ = auVar49._12_4_ & auVar77._12_4_;
    iVar21 = movmskps((int)uVar22,auVar57);
    if (iVar21 == 0) break;
  }
  uVar20 = (undefined4)uVar24;
  uVar29 = CONCAT44(auVar57._4_4_,auVar57._0_4_);
  aVar58._0_8_ = uVar29 ^ 0xffffffffffffffff;
  aVar58._8_4_ = auVar57._8_4_ ^ 0xffffffff;
  aVar58._12_4_ = auVar57._12_4_ ^ 0xffffffff;
LAB_00235c3b:
  terminated.field_0 =
       (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
       ((undefined1  [16])terminated.field_0 | (undefined1  [16])aVar58);
  uVar18 = movmskps(uVar20,(undefined1  [16])terminated.field_0);
  if (uVar18 == 0xf) goto LAB_00235d3a;
  tray.tfar.field_0 =
       (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
       blendvps((undefined1  [16])tray.tfar.field_0,_DAT_01f7aa00,
                (undefined1  [16])terminated.field_0);
  goto LAB_00234d49;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }